

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageInstanceImages::ImageInstanceImages
          (ImageInstanceImages *this,DeviceInterface *vki,VkDevice device,deUint32 queueFamilyIndex,
          VkQueue queue,Allocator *allocator,VkDescriptorType descriptorType,
          VkImageViewType viewType,int numImages,deUint32 baseMipLevel,deUint32 baseArraySlice)

{
  TextureLevelPyramid *pTVar1;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar3;
  VkImageLayout layout;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_d8;
  TextureLevelPyramid *local_b0;
  deUint32 local_a4;
  Allocator *local_a0;
  deUint64 local_98;
  DeviceInterface *pDStack_90;
  VkDevice local_88;
  VkAllocationCallbacks *pVStack_80;
  Move<vk::Handle<(vk::HandleType)13>_> *local_70;
  Move<vk::Handle<(vk::HandleType)9>_> *local_68;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_60;
  Move<vk::Handle<(vk::HandleType)13>_> *local_58;
  Move<vk::Handle<(vk::HandleType)9>_> *local_50;
  TextureLevelPyramid *local_48;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_40;
  VkQueue local_38;
  
  this->m_viewType = viewType;
  this->m_baseMipLevel = baseMipLevel;
  this->m_baseArraySlice = baseArraySlice;
  (this->m_imageFormat).order = RGBA;
  (this->m_imageFormat).type = UNORM_INT8;
  pTVar1 = &this->m_sourceImageA;
  local_a4 = queueFamilyIndex;
  local_a0 = allocator;
  local_38 = queue;
  tcu::TextureLevelPyramid::TextureLevelPyramid(pTVar1,&this->m_imageFormat,2);
  local_b0 = &this->m_sourceImageB;
  local_48 = pTVar1;
  tcu::TextureLevelPyramid::TextureLevelPyramid(local_b0,&this->m_imageFormat,2);
  local_40 = &this->m_imageMemoryA;
  (this->m_imageMemoryA).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  local_60 = &this->m_imageMemoryB;
  (this->m_imageMemoryB).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  local_50 = &this->m_imageA;
  local_68 = &this->m_imageB;
  local_58 = &this->m_imageViewA;
  local_70 = &this->m_imageViewB;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageViewA).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageViewB).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  populateSourceImage(this,pTVar1,true);
  createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,vki,device,local_a0,descriptorType,
              viewType,pTVar1,local_40);
  pMVar3 = local_50;
  local_88 = local_d8.m_data.deleter.m_device;
  pVStack_80 = local_d8.m_data.deleter.m_allocator;
  local_98 = local_d8.m_data.object.m_internal;
  pDStack_90 = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&local_50->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device = local_88;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator = pVStack_80;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_98;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface = pDStack_90;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_d8);
  pTVar1 = local_48;
  createImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_d8,vki,device,viewType,local_48,
                  (VkImage)(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                           object.m_internal,this->m_baseMipLevel,this->m_baseArraySlice);
  pMVar2 = local_58;
  local_88 = local_d8.m_data.deleter.m_device;
  pVStack_80 = local_d8.m_data.deleter.m_allocator;
  local_98 = local_d8.m_data.object.m_internal;
  pDStack_90 = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&local_58->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  layout = (uint)(descriptorType != VK_DESCRIPTOR_TYPE_STORAGE_IMAGE) * 4 + VK_IMAGE_LAYOUT_GENERAL;
  (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = local_88;
  (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVStack_80;
  (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = local_98;
  (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface = pDStack_90
  ;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&local_d8);
  uploadImage(this,vki,device,local_a4,local_38,local_a0,
              (VkImage)(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                       m_internal,layout,pTVar1);
  if (numImages == 2) {
    populateSourceImage(this,local_b0,false);
    createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_d8,vki,device,local_a0,descriptorType
                ,viewType,local_b0,local_60);
    pMVar3 = local_68;
    local_88 = local_d8.m_data.deleter.m_device;
    pVStack_80 = local_d8.m_data.deleter.m_allocator;
    local_98 = local_d8.m_data.object.m_internal;
    pDStack_90 = local_d8.m_data.deleter.m_deviceIface;
    local_d8.m_data.object.m_internal = 0;
    local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_d8.m_data.deleter.m_device = (VkDevice)0x0;
    local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
              (&local_68->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_device = local_88;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_allocator = pVStack_80;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_98;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.deleter.m_deviceIface =
         pDStack_90;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_d8);
    createImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_d8,vki,device,viewType,local_b0,
                    (VkImage)(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                             object.m_internal,this->m_baseMipLevel,this->m_baseArraySlice);
    pMVar2 = local_70;
    local_88 = local_d8.m_data.deleter.m_device;
    pVStack_80 = local_d8.m_data.deleter.m_allocator;
    local_98 = local_d8.m_data.object.m_internal;
    pDStack_90 = local_d8.m_data.deleter.m_deviceIface;
    local_d8.m_data.object.m_internal = 0;
    local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_d8.m_data.deleter.m_device = (VkDevice)0x0;
    local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
              (&local_70->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device = local_88;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVStack_80
    ;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = local_98;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         pDStack_90;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&local_d8);
    uploadImage(this,vki,device,local_a4,local_38,local_a0,
                (VkImage)(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,layout,local_b0);
  }
  return;
}

Assistant:

ImageInstanceImages::ImageInstanceImages (const vk::DeviceInterface&	vki,
										  vk::VkDevice					device,
										  deUint32						queueFamilyIndex,
										  vk::VkQueue					queue,
										  vk::Allocator&				allocator,
										  vk::VkDescriptorType			descriptorType,
										  vk::VkImageViewType			viewType,
										  int							numImages,
										  deUint32						baseMipLevel,
										  deUint32						baseArraySlice)
	: m_viewType		(viewType)
	, m_baseMipLevel	(baseMipLevel)
	, m_baseArraySlice	(baseArraySlice)
	, m_imageFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)
	, m_sourceImageA	(m_imageFormat, NUM_MIP_LEVELS)
	, m_sourceImageB	(m_imageFormat, NUM_MIP_LEVELS)
	, m_imageMemoryA	(DE_NULL)
	, m_imageMemoryB	(DE_NULL)
	, m_imageA			(vk::Move<vk::VkImage>())
	, m_imageB			(vk::Move<vk::VkImage>())
	, m_imageViewA		(vk::Move<vk::VkImageView>())
	, m_imageViewB		(vk::Move<vk::VkImageView>())
{
	const vk::VkImageLayout	layout	= getImageLayoutForDescriptorType(descriptorType);

	DE_ASSERT(numImages == 1 || numImages == 2);

	populateSourceImage(&m_sourceImageA, true);
	m_imageA = createImage(vki, device, allocator, descriptorType, viewType, m_sourceImageA, &m_imageMemoryA);
	m_imageViewA = createImageView(vki, device, viewType, m_sourceImageA, *m_imageA, m_baseMipLevel, m_baseArraySlice);
	uploadImage(vki, device, queueFamilyIndex, queue, allocator, *m_imageA, layout, m_sourceImageA);

	if (numImages == 2)
	{
		populateSourceImage(&m_sourceImageB, false);
		m_imageB = createImage(vki, device, allocator, descriptorType, viewType, m_sourceImageB, &m_imageMemoryB);
		m_imageViewB = createImageView(vki, device, viewType, m_sourceImageB, *m_imageB, m_baseMipLevel, m_baseArraySlice);
		uploadImage(vki, device, queueFamilyIndex, queue, allocator, *m_imageB, layout, m_sourceImageB);
	}
}